

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::Detail::
         rangeToString<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                   (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first
                   ,__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last)

{
  bool bVar1;
  string *in_RDI;
  ReusableStringStream rss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  string local_80 [16];
  ReusableStringStream *in_stack_ffffffffffffff90;
  ReusableStringStream *in_stack_ffffffffffffffa0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_10 [2];
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff90);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                     in_stack_ffffffffffffff60,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                     in_stack_ffffffffffffff58);
  if (bVar1) {
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::operator*
              (local_10);
    stringify<char>((char *)in_stack_ffffffffffffff58);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(local_10);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffff60,
                              (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      in_stack_ffffffffffffff60 =
           ReusableStringStream::operator<<
                     (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator*(local_10);
      stringify<char>((char *)in_stack_ffffffffffffff58);
      ReusableStringStream::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(local_80);
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator++(local_10);
    }
  }
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_ffffffffffffff58);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffa0);
  return in_RDI;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }